

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O3

Info * __thiscall CMU462::Halfedge::getInfo_abi_cxx11_(Info *__return_storage_ptr__,Halfedge *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  char *pcVar3;
  ostringstream m8;
  ostringstream m7;
  ostringstream m6;
  ostringstream m5;
  ostringstream m4;
  ostringstream m3;
  ostringstream m2;
  ostringstream m1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf8;
  ostringstream local_bd8 [112];
  ios_base local_b68 [264];
  ostringstream local_a60 [112];
  ios_base local_9f0 [264];
  ostringstream local_8e8 [112];
  ios_base local_878 [264];
  ostringstream local_770 [112];
  ios_base local_700 [264];
  ostringstream local_5f8 [112];
  ios_base local_588 [264];
  ostringstream local_480 [112];
  ios_base local_410 [264];
  ostringstream local_308 [112];
  ios_base local_298 [264];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_308);
  std::__cxx11::ostringstream::ostringstream(local_480);
  std::__cxx11::ostringstream::ostringstream(local_5f8);
  std::__cxx11::ostringstream::ostringstream(local_770);
  std::__cxx11::ostringstream::ostringstream(local_8e8);
  std::__cxx11::ostringstream::ostringstream(local_a60);
  std::__cxx11::ostringstream::ostringstream(local_bd8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"HALFEDGE",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_308,"Address: ",9);
  std::ostream::_M_insert<void_const*>(local_308);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_480,"Twin: ",6);
  std::ostream::_M_insert<void_const*>(local_480);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5f8,"Next: ",6);
  std::ostream::_M_insert<void_const*>(local_5f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_770,"Vertex: ",8);
  std::ostream::_M_insert<void_const*>(local_770);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_8e8,"Edge: ",6);
  std::ostream::_M_insert<void_const*>(local_8e8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a60,"Face: ",6);
  std::ostream::_M_insert<void_const*>(local_a60);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_bd8,"Boundary: ",10);
  uVar2 = (ulong)*(byte *)&(this->_face)._M_node[0xc]._M_next;
  pcVar3 = "NO";
  if (uVar2 != 0) {
    pcVar3 = "YES";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_bd8,pcVar3,uVar2 | 2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,8);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  paVar1 = &local_bf8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != paVar1) {
    operator_delete(local_bf8._M_dataplus._M_p,
                    CONCAT71(local_bf8.field_2._M_allocated_capacity._1_7_,
                             local_bf8.field_2._M_local_buf[0]) + 1);
  }
  local_bf8._M_string_length = 0;
  local_bf8.field_2._M_local_buf[0] = '\0';
  local_bf8._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != paVar1) {
    operator_delete(local_bf8._M_dataplus._M_p,
                    CONCAT71(local_bf8.field_2._M_allocated_capacity._1_7_,
                             local_bf8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != paVar1) {
    operator_delete(local_bf8._M_dataplus._M_p,
                    CONCAT71(local_bf8.field_2._M_allocated_capacity._1_7_,
                             local_bf8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != paVar1) {
    operator_delete(local_bf8._M_dataplus._M_p,
                    CONCAT71(local_bf8.field_2._M_allocated_capacity._1_7_,
                             local_bf8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != paVar1) {
    operator_delete(local_bf8._M_dataplus._M_p,
                    CONCAT71(local_bf8.field_2._M_allocated_capacity._1_7_,
                             local_bf8.field_2._M_local_buf[0]) + 1);
  }
  local_bf8._M_string_length = 0;
  local_bf8.field_2._M_local_buf[0] = '\0';
  local_bf8._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != paVar1) {
    operator_delete(local_bf8._M_dataplus._M_p,
                    CONCAT71(local_bf8.field_2._M_allocated_capacity._1_7_,
                             local_bf8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != paVar1) {
    operator_delete(local_bf8._M_dataplus._M_p,
                    CONCAT71(local_bf8.field_2._M_allocated_capacity._1_7_,
                             local_bf8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != paVar1) {
    operator_delete(local_bf8._M_dataplus._M_p,
                    CONCAT71(local_bf8.field_2._M_allocated_capacity._1_7_,
                             local_bf8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != paVar1) {
    operator_delete(local_bf8._M_dataplus._M_p,
                    CONCAT71(local_bf8.field_2._M_allocated_capacity._1_7_,
                             local_bf8.field_2._M_local_buf[0]) + 1);
  }
  local_bf8._M_string_length = 0;
  local_bf8.field_2._M_local_buf[0] = '\0';
  local_bf8._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != paVar1) {
    operator_delete(local_bf8._M_dataplus._M_p,
                    CONCAT71(local_bf8.field_2._M_allocated_capacity._1_7_,
                             local_bf8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != paVar1) {
    operator_delete(local_bf8._M_dataplus._M_p,
                    CONCAT71(local_bf8.field_2._M_allocated_capacity._1_7_,
                             local_bf8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_bd8);
  std::ios_base::~ios_base(local_b68);
  std::__cxx11::ostringstream::~ostringstream(local_a60);
  std::ios_base::~ios_base(local_9f0);
  std::__cxx11::ostringstream::~ostringstream(local_8e8);
  std::ios_base::~ios_base(local_878);
  std::__cxx11::ostringstream::~ostringstream(local_770);
  std::ios_base::~ios_base(local_700);
  std::__cxx11::ostringstream::~ostringstream(local_5f8);
  std::ios_base::~ios_base(local_588);
  std::__cxx11::ostringstream::~ostringstream(local_480);
  std::ios_base::~ios_base(local_410);
  std::__cxx11::ostringstream::~ostringstream(local_308);
  std::ios_base::~ios_base(local_298);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

Info Halfedge::getInfo()
  {
    Info info;

    ostringstream m1, m2, m3, m4, m5, m6, m7, m8;
    m1 << "HALFEDGE";
    m2 << "Address: "  << this;
    m3 << "Twin: "     << elementAddress(twin());
    m4 << "Next: "     << elementAddress(next());
    m5 << "Vertex: "   << elementAddress(vertex());
    m6 << "Edge: "     << elementAddress(edge());
    m7 << "Face: "     << elementAddress(face());
    m8 << "Boundary: " << (isBoundary() ? "YES" : "NO");

    info.reserve(8);
    info.push_back(m1.str());
    info.push_back(string());
    info.push_back(m2.str());
    info.push_back(m3.str());
    info.push_back(m4.str());
    info.push_back(string());
    info.push_back(m5.str());
    info.push_back(m6.str());
    info.push_back(m7.str());
    info.push_back(string());
    info.push_back(m8.str());

    return info;
  }